

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.h
# Opt level: O0

void __thiscall
Environment::Update(Environment *this,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *particles)

{
  double _x;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  _InputArray local_180;
  allocator local_161;
  string local_160 [32];
  Scalar_<double> local_140;
  Point_<double> local_120;
  Point_ local_110 [8];
  _InputOutputArray local_108;
  int local_ec;
  undefined1 local_e8 [4];
  int i;
  Point_<int> local_c4 [2];
  _InputOutputArray local_b0;
  Scalar_ local_98 [32];
  Mat local_78 [8];
  Mat Env;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *particles_local;
  Environment *this_local;
  
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_98,0.0,0.0,0.0,0.0);
  cv::Mat::Mat(local_78,0x1e0,0x280,0x10,local_98);
  cv::_InputOutputArray::_InputOutputArray(&local_b0,local_78);
  cv::Point_<int>::Point_(local_c4,&this->goal);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_e8,0.0,255.0,0.0,0.0);
  cv::circle(&local_b0,local_c4,8,local_e8,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_b0);
  local_ec = 0;
  while( true ) {
    uVar1 = (ulong)local_ec;
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(particles);
    if (sVar2 <= uVar1) break;
    cv::_InputOutputArray::_InputOutputArray(&local_108,local_78);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](particles,(long)local_ec);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
    _x = *pvVar4;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](particles,(long)local_ec);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
    cv::Point_<double>::Point_(&local_120,_x,*pvVar4);
    cv::Point_::operator_cast_to_Point_(local_110);
    cv::Scalar_<double>::Scalar_(&local_140,255.0,255.0,255.0,0.0);
    cv::circle(&local_108,local_110,8,&local_140,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_108);
    local_ec = local_ec + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"Environment",&local_161);
  cv::_InputArray::_InputArray(&local_180,local_78);
  cv::imshow(local_160,&local_180);
  cv::_InputArray::~_InputArray(&local_180);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  cv::waitKey(300);
  cv::Mat::~Mat(local_78);
  return;
}

Assistant:

void Environment::Update( vector <vector<double> > particles )
{
    Mat Env( 480, 640, CV_8UC3, Scalar(0, 0, 0) );
    circle( Env, goal, 8.0, Scalar( 0, 255, 0 ), -1, 8 );
    for( int i = 0; i < particles.size(); i++ )
    {
        circle( Env, Point2d( particles[i][0], particles[i][1] ), 8.0, Scalar( 255, 255, 255 ), -1, 8 );
    }
    imshow("Environment", Env);
    waitKey(300);
}